

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::shaderexecutor::anon_unknown_0::AtomicCounterIndexingCase::createInstance
          (AtomicCounterIndexingCase *this,Context *ctx)

{
  AtomicCounterIndexingCaseInstance *this_00;
  Context *ctx_local;
  AtomicCounterIndexingCase *this_local;
  
  this_00 = (AtomicCounterIndexingCaseInstance *)operator_new(0x40);
  AtomicCounterIndexingCaseInstance::AtomicCounterIndexingCaseInstance
            (this_00,ctx,(this->super_OpaqueTypeIndexingCase).m_shaderType,
             &(this->super_OpaqueTypeIndexingCase).m_shaderSpec,
             (this->super_OpaqueTypeIndexingCase).m_name,&this->m_opIndices,
             (this->super_OpaqueTypeIndexingCase).m_indexExprType);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* AtomicCounterIndexingCase::createInstance (Context& ctx) const
{
	return new AtomicCounterIndexingCaseInstance(ctx,
												 m_shaderType,
												 m_shaderSpec,
												 m_name,
												 m_opIndices,
												 m_indexExprType);
}